

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<long>::Clear
          (RepeatedFieldWrapper<long> *this,Field *data)

{
  RepeatedFieldType *this_00;
  Field *data_local;
  RepeatedFieldWrapper<long> *this_local;
  
  this_00 = MutableRepeatedField(data);
  RepeatedField<long>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }